

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O0

id_type __thiscall Darts::Details::DawgBuilder::hash_unit(DawgBuilder *this,id_type id)

{
  bool bVar1;
  id_type iVar2;
  DawgUnit *pDVar3;
  byte *pbVar4;
  uint uStack_18;
  uchar_type label;
  id_type unit;
  id_type hash_value;
  id_type id_local;
  DawgBuilder *this_local;
  
  uStack_18 = 0;
  unit = id;
  while( true ) {
    if (unit == 0) {
      return uStack_18;
    }
    pDVar3 = AutoPool<Darts::Details::DawgUnit>::operator[](&this->units_,(ulong)unit);
    iVar2 = DawgUnit::unit(pDVar3);
    pbVar4 = AutoPool<unsigned_char>::operator[](&this->labels_,(ulong)unit);
    iVar2 = hash((uint)*pbVar4 << 0x18 ^ iVar2);
    uStack_18 = iVar2 ^ uStack_18;
    pDVar3 = AutoPool<Darts::Details::DawgUnit>::operator[](&this->units_,(ulong)unit);
    bVar1 = DawgUnit::has_sibling(pDVar3);
    if (!bVar1) break;
    unit = unit + 1;
  }
  return uStack_18;
}

Assistant:

inline id_type DawgBuilder::hash_unit(id_type id) const {
  id_type hash_value = 0;
  for ( ; id != 0; ++id) {
    id_type unit = units_[id].unit();
    uchar_type label = labels_[id];
    hash_value ^= hash((label << 24) ^ unit);

    if (units_[id].has_sibling() == false) {
      break;
    }
  }
  return hash_value;
}